

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

void __thiscall docopt::Option::Option(Option *this,Option *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Kind KVar4;
  pointer pcVar5;
  pointer pbVar6;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  
  (this->super_LeafPattern).super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001992f8;
  paVar3 = &(this->super_LeafPattern).fName.field_2;
  (this->super_LeafPattern).fName._M_dataplus._M_p = (pointer)paVar3;
  pcVar5 = (param_2->super_LeafPattern).fName._M_dataplus._M_p;
  paVar8 = &(param_2->super_LeafPattern).fName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar8) {
    uVar7 = *(undefined8 *)((long)&(param_2->super_LeafPattern).fName.field_2 + 8);
    paVar3->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_LeafPattern).fName.field_2 + 8) = uVar7;
  }
  else {
    (this->super_LeafPattern).fName._M_dataplus._M_p = pcVar5;
    (this->super_LeafPattern).fName.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  (this->super_LeafPattern).fName._M_string_length =
       (param_2->super_LeafPattern).fName._M_string_length;
  (param_2->super_LeafPattern).fName._M_dataplus._M_p = (pointer)paVar8;
  (param_2->super_LeafPattern).fName._M_string_length = 0;
  (param_2->super_LeafPattern).fName.field_2._M_local_buf[0] = '\0';
  KVar4 = (param_2->super_LeafPattern).fValue.kind;
  (this->super_LeafPattern).fValue.kind = KVar4;
  switch(KVar4) {
  case Bool:
    (this->super_LeafPattern).fValue.variant.boolValue =
         (param_2->super_LeafPattern).fValue.variant.boolValue;
    break;
  case Long:
    (this->super_LeafPattern).fValue.variant.longValue =
         (param_2->super_LeafPattern).fValue.variant.longValue;
    break;
  case String:
    pbVar1 = (pointer)&(this->super_LeafPattern).fValue.variant.strList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->super_LeafPattern).fValue.variant.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar1;
    pbVar6 = (pointer)(param_2->super_LeafPattern).fValue.variant.longValue;
    pbVar2 = (pointer)&(param_2->super_LeafPattern).fValue.variant.strList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pbVar6 == pbVar2) {
      uVar7 = *(undefined8 *)((long)&(param_2->super_LeafPattern).fValue.variant + 0x18);
      (pbVar1->_M_dataplus)._M_p = (pointer)(pbVar2->_M_dataplus)._M_p;
      *(undefined8 *)((long)&(this->super_LeafPattern).fValue.variant + 0x18) = uVar7;
    }
    else {
      (this->super_LeafPattern).fValue.variant.longValue = (long)pbVar6;
      (this->super_LeafPattern).fValue.variant.strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar2->_M_dataplus)._M_p;
    }
    (this->super_LeafPattern).fValue.variant.strValue._M_string_length =
         (param_2->super_LeafPattern).fValue.variant.strValue._M_string_length;
    (param_2->super_LeafPattern).fValue.variant.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar2;
    (param_2->super_LeafPattern).fValue.variant.strValue._M_string_length = 0;
    *(undefined1 *)((long)&(param_2->super_LeafPattern).fValue.variant + 0x10) = 0;
    break;
  case StringList:
    (this->super_LeafPattern).fValue.variant.longValue =
         (param_2->super_LeafPattern).fValue.variant.longValue;
    (this->super_LeafPattern).fValue.variant.strValue._M_string_length =
         (param_2->super_LeafPattern).fValue.variant.strValue._M_string_length;
    (this->super_LeafPattern).fValue.variant.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (param_2->super_LeafPattern).fValue.variant.strList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (param_2->super_LeafPattern).fValue.variant.longValue = 0;
    (param_2->super_LeafPattern).fValue.variant.strValue._M_string_length = 0;
    (param_2->super_LeafPattern).fValue.variant.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  (this->super_LeafPattern).super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_00199418;
  paVar3 = &(this->fShortOption).field_2;
  (this->fShortOption)._M_dataplus._M_p = (pointer)paVar3;
  pcVar5 = (param_2->fShortOption)._M_dataplus._M_p;
  paVar8 = &(param_2->fShortOption).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar8) {
    uVar7 = *(undefined8 *)((long)&(param_2->fShortOption).field_2 + 8);
    paVar3->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fShortOption).field_2 + 8) = uVar7;
  }
  else {
    (this->fShortOption)._M_dataplus._M_p = pcVar5;
    (this->fShortOption).field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  (this->fShortOption)._M_string_length = (param_2->fShortOption)._M_string_length;
  (param_2->fShortOption)._M_dataplus._M_p = (pointer)paVar8;
  (param_2->fShortOption)._M_string_length = 0;
  (param_2->fShortOption).field_2._M_local_buf[0] = '\0';
  paVar3 = &(this->fLongOption).field_2;
  (this->fLongOption)._M_dataplus._M_p = (pointer)paVar3;
  pcVar5 = (param_2->fLongOption)._M_dataplus._M_p;
  paVar8 = &(param_2->fLongOption).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar8) {
    uVar7 = *(undefined8 *)((long)&(param_2->fLongOption).field_2 + 8);
    paVar3->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fLongOption).field_2 + 8) = uVar7;
  }
  else {
    (this->fLongOption)._M_dataplus._M_p = pcVar5;
    (this->fLongOption).field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  (this->fLongOption)._M_string_length = (param_2->fLongOption)._M_string_length;
  (param_2->fLongOption)._M_dataplus._M_p = (pointer)paVar8;
  (param_2->fLongOption)._M_string_length = 0;
  (param_2->fLongOption).field_2._M_local_buf[0] = '\0';
  this->fArgcount = param_2->fArgcount;
  return;
}

Assistant:

Option(Option&&) = default;